

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alphabet.c
# Opt level: O2

void vrna_aln_encode(char *sequence,short **S_p,short **s5_p,short **s3_p,char **ss_p,uint **as_p,
                    vrna_md_t *md)

{
  byte bVar1;
  short sVar2;
  size_t sVar3;
  short *psVar4;
  uint *puVar5;
  char *pcVar6;
  ulong uVar7;
  short *psVar8;
  uint uVar9;
  ulong uVar10;
  short *psVar11;
  uint uVar12;
  
  sVar3 = strlen(sequence);
  uVar9 = (uint)sVar3;
  uVar12 = uVar9 * 2 + 4;
  psVar4 = (short *)vrna_alloc(uVar12);
  *s5_p = psVar4;
  psVar4 = (short *)vrna_alloc(uVar12);
  *s3_p = psVar4;
  puVar5 = (uint *)vrna_alloc(uVar9 * 4 + 8);
  *as_p = puVar5;
  pcVar6 = (char *)vrna_alloc(uVar9 + 2);
  *ss_p = pcVar6;
  psVar4 = vrna_seq_encode_simple(sequence,md);
  *S_p = psVar4;
  psVar8 = *s5_p;
  psVar8[0] = 0;
  psVar8[1] = 0;
  if (md->oldAliEn == 0) {
    if (md->circ == 0) {
      (*s3_p)[sVar3 & 0xffffffff] = 0;
      psVar8[1] = 0;
    }
    else {
      uVar10 = sVar3 & 0xffffffff;
      do {
        uVar7 = uVar10;
        uVar10 = uVar7 - 1;
        if (uVar7 == 0) goto LAB_00124488;
        bVar1 = sequence[uVar7 - 1];
      } while (((bVar1 - 0x2d < 2) || (bVar1 == 0x7e)) || (bVar1 == 0x5f));
      psVar8[1] = psVar4[uVar7 & 0xffffffff];
LAB_00124488:
      for (uVar12 = 1; uVar12 <= uVar9; uVar12 = uVar12 + 1) {
        bVar1 = sequence[uVar12 - 1];
        if (((1 < bVar1 - 0x2d) && (bVar1 != 0x5f)) && (bVar1 != 0x7e)) {
          (*s3_p)[sVar3 & 0xffffffff] = psVar4[uVar12];
          break;
        }
      }
    }
    uVar9 = 0;
    uVar10 = 1;
    while (uVar7 = sVar3 & 0xffffffff, uVar10 <= (sVar3 & 0xffffffff)) {
      bVar1 = sequence[uVar10 - 1];
      psVar11 = psVar8;
      if (((1 < bVar1 - 0x2d) && (bVar1 != 0x5f)) && (bVar1 != 0x7e)) {
        uVar7 = (ulong)uVar9;
        uVar9 = uVar9 + 1;
        (*ss_p)[uVar7] = bVar1;
        psVar4 = *S_p;
        psVar8 = *s5_p;
        psVar11 = psVar4;
      }
      psVar8[uVar10 + 1 & 0xffffffff] = psVar11[uVar10];
      (*as_p)[uVar10] = uVar9;
      uVar10 = uVar10 + 1;
    }
    while (uVar10 = uVar7 - 1, uVar10 != 0xffffffffffffffff) {
      bVar1 = sequence[uVar10 & 0xffffffff];
      if (((bVar1 - 0x2d < 2) || (bVar1 == 0x7e)) || (bVar1 == 0x5f)) {
        psVar8 = *s3_p;
        psVar11 = psVar8;
      }
      else {
        psVar8 = *s3_p;
        psVar11 = psVar4;
      }
      psVar8[uVar10 & 0xffffffff] = psVar11[uVar7];
      uVar7 = uVar10;
    }
  }
  else {
    **ss_p = *sequence;
    uVar10 = 0;
    while (uVar7 = uVar10 + 1, uVar7 < (sVar3 & 0xffffffff)) {
      psVar4 = *S_p;
      (*s5_p)[uVar10 + 1] = psVar4[uVar10];
      (*s3_p)[uVar10 + 1] = psVar4[uVar10 + 2];
      (*ss_p)[uVar10 + 1] = sequence[uVar10 + 1];
      (*as_p)[uVar10 + 1] = (uint)uVar7;
      uVar10 = uVar7;
    }
    uVar10 = sVar3 & 0xffffffff;
    (*ss_p)[uVar10] = sequence[uVar10];
    (*as_p)[uVar10] = uVar9;
    psVar4 = *S_p;
    psVar8 = *s5_p;
    psVar8[uVar10] = psVar4[uVar9 - 1];
    psVar11 = *s3_p;
    psVar11[uVar10] = 0;
    psVar4[uVar9 + 1] = psVar4[1];
    psVar8[1] = 0;
    if (md->circ != 0) {
      psVar8[1] = psVar4[uVar10];
      sVar2 = psVar4[1];
      psVar11[uVar10] = sVar2;
      (*ss_p)[uVar9 + 1] = (char)sVar2;
    }
  }
  return;
}

Assistant:

PUBLIC void
vrna_aln_encode(const char    *sequence,
                short         **S_p,
                short         **s5_p,
                short         **s3_p,
                char          **ss_p,
                unsigned int  **as_p,
                vrna_md_t     *md)
{
  unsigned int i, l, p;

  l = strlen(sequence);

  (*s5_p) = (short *)vrna_alloc((l + 2) * sizeof(short));
  (*s3_p) = (short *)vrna_alloc((l + 2) * sizeof(short));
  (*as_p) = (unsigned int *)vrna_alloc((l + 2) * sizeof(unsigned int));
  (*ss_p) = (char *)vrna_alloc((l + 2) * sizeof(char));

  /* make numerical encoding of sequence */
  (*S_p) = vrna_seq_encode_simple(sequence, md);

  (*s5_p)[0] = (*s5_p)[1] = 0;

  if (md->oldAliEn) {
    /* use alignment sequences in all energy evaluations */
    (*ss_p)[0] = sequence[0];
    for (i = 1; i < l; i++) {
      (*s5_p)[i]  = (*S_p)[i - 1];
      (*s3_p)[i]  = (*S_p)[i + 1];
      (*ss_p)[i]  = sequence[i];
      (*as_p)[i]  = i;
    }
    (*ss_p)[l]    = sequence[l];
    (*as_p)[l]    = l;
    (*s5_p)[l]    = (*S_p)[l - 1];
    (*s3_p)[l]    = 0;
    (*S_p)[l + 1] = (*S_p)[1];
    (*s5_p)[1]    = 0;
    if (md->circ) {
      (*s5_p)[1]      = (*S_p)[l];
      (*s3_p)[l]      = (*S_p)[1];
      (*ss_p)[l + 1]  = (*S_p)[1];
    }
  } else {
    if (md->circ) {
      for (i = l; i > 0; i--) {
        char c5;
        c5 = sequence[i - 1];
        if ((c5 == '-') || (c5 == '_') || (c5 == '~') || (c5 == '.'))
          continue;

        (*s5_p)[1] = (*S_p)[i];
        break;
      }
      for (i = 1; i <= l; i++) {
        char c3;
        c3 = sequence[i - 1];
        if ((c3 == '-') || (c3 == '_') || (c3 == '~') || (c3 == '.'))
          continue;

        (*s3_p)[l] = (*S_p)[i];
        break;
      }
    } else {
      (*s5_p)[1] = (*s3_p)[l] = 0;
    }

    for (i = 1, p = 0; i <= l; i++) {
      char c5;
      c5 = sequence[i - 1];
      if ((c5 == '-') || (c5 == '_') || (c5 == '~') || (c5 == '.')) {
        (*s5_p)[i + 1] = (*s5_p)[i];
      } else {
        /* no gap */
        (*ss_p)[p++]    = sequence[i - 1]; /*start at 0!!*/
        (*s5_p)[i + 1]  = (*S_p)[i];
      }

      (*as_p)[i] = p;
    }
    for (i = l; i >= 1; i--) {
      char c3;
      c3 = sequence[i - 1];
      if ((c3 == '-') || (c3 == '_') || (c3 == '~') || (c3 == '.'))
        (*s3_p)[i - 1] = (*s3_p)[i];
      else
        (*s3_p)[i - 1] = (*S_p)[i];
    }
  }
}